

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

bool anon_unknown.dwarf_1849b::extract_tar(char *outFileName,bool verbose,bool extract)

{
  FILE *__stream;
  archive_entry *entry_00;
  wchar_t wVar1;
  uint uVar2;
  mode_t mVar3;
  int iVar4;
  wchar_t wVar5;
  archive *a;
  archive *_a;
  char *pcVar6;
  Encoding *pEVar7;
  wstring *__s;
  la_int64_t lVar8;
  ulong uVar9;
  dev_t dVar10;
  dev_t dVar11;
  size_t sVar12;
  tm *__tp;
  la_ssize_t r;
  long *plVar13;
  size_type *psVar14;
  char *cstr;
  wchar_t *wcstr;
  wchar_t *wcstr_00;
  wchar_t *wcstr_01;
  wchar_t *wcstr_02;
  undefined7 in_register_00000031;
  char *__format;
  bool bVar15;
  archive_entry *entry;
  char tmp [100];
  time_t tim;
  size_t size;
  cmLocaleRAII localeRAII;
  archive_entry *local_100;
  wstring local_f8 [3];
  time_t local_88;
  undefined4 local_7c;
  string local_78;
  size_t local_58;
  cmLocaleRAII local_50;
  
  local_7c = (undefined4)CONCAT71(in_register_00000031,verbose);
  cmLocaleRAII::cmLocaleRAII(&local_50);
  a = archive_read_new();
  _a = archive_write_disk_new();
  archive_read_support_filter_all(a);
  archive_read_support_format_all(a);
  cmsys::Encoding::ToWide_abi_cxx11_(local_f8,(Encoding *)outFileName,cstr);
  wVar1 = archive_read_open_filename_w(a,local_f8[0]._M_dataplus._M_p,0x2800);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_f8[0]._M_dataplus._M_p != &local_f8[0].field_2) {
    operator_delete(local_f8[0]._M_dataplus._M_p,local_f8[0].field_2._M_allocated_capacity * 4 + 4);
  }
  if (wVar1 == L'\0') {
LAB_00114e13:
    do {
      wVar5 = archive_read_next_header(a,&local_100);
      entry_00 = local_100;
      __stream = _stdout;
      wVar1 = wVar5;
      if (wVar5 != L'\0') {
        if (wVar5 != L'\x01') {
          pcVar6 = archive_error_string(a);
          cmSystemTools::Error
                    ("Problem with archive_read_next_header(): ",pcVar6,(char *)0x0,(char *)0x0);
        }
        goto LAB_00114f78;
      }
      if ((char)local_7c == '\0') {
        if (!extract) {
          pEVar7 = (Encoding *)archive_entry_pathname_w(local_100);
          cmsys::Encoding::ToNarrow_abi_cxx11_((string *)local_f8,pEVar7,wcstr_00);
          cmSystemTools::Stdout((string *)local_f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
               *)local_f8[0]._M_dataplus._M_p != &local_f8[0].field_2) {
            operator_delete(local_f8[0]._M_dataplus._M_p,
                            local_f8[0].field_2._M_allocated_capacity + 1);
          }
          local_f8[0]._M_dataplus._M_p = (pointer)&local_f8[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"\n","");
          cmSystemTools::Stdout((string *)local_f8);
          goto LAB_00114d45;
        }
      }
      else {
        if (extract) {
          local_f8[0]._M_dataplus._M_p = (pointer)&local_f8[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"x ","");
          cmSystemTools::Stdout((string *)local_f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
               *)local_f8[0]._M_dataplus._M_p != &local_f8[0].field_2) {
            operator_delete(local_f8[0]._M_dataplus._M_p,
                            local_f8[0].field_2._M_allocated_capacity + 1);
          }
          pEVar7 = (Encoding *)archive_entry_pathname_w(local_100);
          cmsys::Encoding::ToNarrow_abi_cxx11_((string *)local_f8,pEVar7,wcstr);
          cmSystemTools::Stdout((string *)local_f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
               *)local_f8[0]._M_dataplus._M_p != &local_f8[0].field_2) {
            operator_delete(local_f8[0]._M_dataplus._M_p,
                            local_f8[0].field_2._M_allocated_capacity + 1);
          }
        }
        else {
          if ((anonymous_namespace)::list_item_verbose(_IO_FILE*,archive_entry*)::now == 0) {
            time(&(anonymous_namespace)::list_item_verbose(_IO_FILE*,archive_entry*)::now);
          }
          pcVar6 = archive_entry_strmode((archive_entry_conflict *)entry_00);
          uVar2 = archive_entry_nlink(entry_00);
          fprintf(__stream,"%s %d ",pcVar6,(ulong)uVar2);
          __s = (wstring *)archive_entry_uname(entry_00);
          if ((__s == (wstring *)0x0) || (*(char *)&(__s->_M_dataplus)._M_p == '\0')) {
            lVar8 = archive_entry_uid(entry_00);
            sprintf((char *)local_f8,"%lu ",lVar8);
            __s = local_f8;
          }
          uVar9 = strlen((char *)__s);
          if (uVar9 < 7) {
            uVar9 = 6;
          }
          fprintf(__stream,"%-*s ",uVar9 & 0xffffffff,__s);
          pcVar6 = archive_entry_gname(entry_00);
          if ((pcVar6 == (char *)0x0) || (*pcVar6 == '\0')) {
            lVar8 = archive_entry_gid(entry_00);
            sprintf((char *)local_f8,"%lu",lVar8);
            local_58 = strlen((char *)local_f8);
            fputs((char *)local_f8,__stream);
          }
          else {
            fputs(pcVar6,__stream);
            local_58 = strlen(pcVar6);
          }
          mVar3 = archive_entry_filetype(entry_00);
          if ((mVar3 == 0x2000) || (mVar3 = archive_entry_filetype(entry_00), mVar3 == 0x6000)) {
            dVar10 = archive_entry_rdevmajor(entry_00);
            dVar11 = archive_entry_rdevminor(entry_00);
            sprintf((char *)local_f8,"%lu,%lu",dVar10,dVar11);
          }
          else {
            lVar8 = archive_entry_size(entry_00);
            sprintf((char *)local_f8,"%lu",lVar8);
          }
          sVar12 = strlen((char *)local_f8);
          iVar4 = (int)(sVar12 + local_58) + 1;
          if (sVar12 + local_58 < 0xd) {
            iVar4 = 0xd;
          }
          fprintf(__stream,"%*s",(ulong)(uint)(iVar4 - (int)local_58),local_f8);
          local_88 = archive_entry_mtime(entry_00);
          pcVar6 = "%e %b %H:%M";
          if ((anonymous_namespace)::list_item_verbose(_IO_FILE*,archive_entry*)::now + 0xf099c0 <
              local_88) {
            pcVar6 = "%e %b  %Y";
          }
          if (local_88 <
              (anonymous_namespace)::list_item_verbose(_IO_FILE*,archive_entry*)::now + -0xf099c0) {
            pcVar6 = "%e %b  %Y";
          }
          __tp = localtime(&local_88);
          strftime((char *)local_f8,100,pcVar6,__tp);
          fprintf(__stream," %s ",local_f8);
          pEVar7 = (Encoding *)archive_entry_pathname_w(entry_00);
          cmsys::Encoding::ToNarrow_abi_cxx11_(&local_78,pEVar7,wcstr_01);
          fputs(local_78._M_dataplus._M_p,__stream);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
          pcVar6 = archive_entry_hardlink(entry_00);
          if (pcVar6 == (char *)0x0) {
            pcVar6 = archive_entry_symlink(entry_00);
            if (pcVar6 != (char *)0x0) {
              pcVar6 = archive_entry_symlink(entry_00);
              __format = " -> %s";
              goto LAB_00114d0b;
            }
          }
          else {
            pcVar6 = archive_entry_hardlink(entry_00);
            __format = " link to %s";
LAB_00114d0b:
            fprintf(__stream,__format,pcVar6);
          }
          fflush(__stream);
        }
        local_f8[0]._M_dataplus._M_p = (pointer)&local_f8[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"\n","");
        cmSystemTools::Stdout((string *)local_f8);
LAB_00114d45:
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_f8[0]._M_dataplus._M_p != &local_f8[0].field_2) {
          operator_delete(local_f8[0]._M_dataplus._M_p,local_f8[0].field_2._M_allocated_capacity + 1
                         );
        }
        if (!extract) goto LAB_00114e13;
      }
      wVar1 = archive_write_disk_set_options(_a,L'\x04');
      if (wVar1 != L'\0') {
        pcVar6 = archive_error_string(_a);
        cmSystemTools::Error
                  ("Problem with archive_write_disk_set_options(): ",pcVar6,(char *)0x0,(char *)0x0)
        ;
        goto LAB_00114f78;
      }
      wVar1 = archive_write_header(_a,local_100);
      if (wVar1 != L'\0') {
        pcVar6 = archive_error_string(_a);
        cmSystemTools::Error("Problem with archive_write_header(): ",pcVar6,(char *)0x0,(char *)0x0)
        ;
        pEVar7 = (Encoding *)archive_entry_pathname_w(local_100);
        cmsys::Encoding::ToNarrow_abi_cxx11_(&local_78,pEVar7,wcstr_02);
        plVar13 = (long *)std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,0x1c6975);
        local_f8[0]._M_dataplus._M_p = (pointer)&local_f8[0].field_2;
        psVar14 = (size_type *)(plVar13 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)*plVar13 ==
            (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)psVar14) {
          local_f8[0].field_2._0_8_ = *psVar14;
          local_f8[0].field_2._8_8_ = plVar13[3];
        }
        else {
          local_f8[0].field_2._0_8_ = *psVar14;
          local_f8[0]._M_dataplus._M_p = (pointer)*plVar13;
        }
        local_f8[0]._M_string_length = plVar13[1];
        *plVar13 = (long)psVar14;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        cmSystemTools::Error((string *)local_f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_f8[0]._M_dataplus._M_p != &local_f8[0].field_2) {
          operator_delete(local_f8[0]._M_dataplus._M_p,local_f8[0].field_2._M_allocated_capacity + 1
                         );
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        goto LAB_00114f78;
      }
      do {
        iVar4 = archive_read_data_block(a,(void **)local_f8,(size_t *)&local_78,&local_88);
        if (iVar4 == 1) goto LAB_00114e00;
        bVar15 = la_diagnostic(a,(long)iVar4);
        if (!bVar15) break;
        r = archive_write_data_block
                      (_a,local_f8[0]._M_dataplus._M_p,(size_t)local_78._M_dataplus._M_p,local_88);
        bVar15 = la_diagnostic(a,r);
      } while (bVar15);
      wVar1 = wVar5;
      if (iVar4 != 1) goto LAB_00114f78;
LAB_00114e00:
      wVar1 = archive_write_finish_entry(_a);
      if (wVar1 != L'\0') goto LAB_00114ef0;
    } while( true );
  }
  pcVar6 = archive_error_string(a);
  cmSystemTools::Error("Problem with archive_read_open_file(): ",pcVar6,(char *)0x0,(char *)0x0);
  archive_write_free(_a);
  archive_read_close(a);
  bVar15 = false;
LAB_00114f97:
  cmLocaleRAII::~cmLocaleRAII(&local_50);
  return bVar15;
LAB_00114ef0:
  pcVar6 = archive_error_string(_a);
  cmSystemTools::Error("Problem with archive_write_finish_entry(): ",pcVar6,(char *)0x0,(char *)0x0)
  ;
LAB_00114f78:
  archive_write_free(_a);
  archive_read_close(a);
  archive_read_free(a);
  bVar15 = (uint)wVar1 < 2;
  goto LAB_00114f97;
}

Assistant:

bool extract_tar(const char* outFileName, bool verbose, bool extract)
{
  cmLocaleRAII localeRAII;
  static_cast<void>(localeRAII);
  struct archive* a = archive_read_new();
  struct archive* ext = archive_write_disk_new();
  archive_read_support_filter_all(a);
  archive_read_support_format_all(a);
  struct archive_entry* entry;
  int r = cm_archive_read_open_file(a, outFileName, 10240);
  if (r) {
    cmSystemTools::Error("Problem with archive_read_open_file(): ",
                         archive_error_string(a));
    archive_write_free(ext);
    archive_read_close(a);
    return false;
  }
  for (;;) {
    r = archive_read_next_header(a, &entry);
    if (r == ARCHIVE_EOF) {
      break;
    }
    if (r != ARCHIVE_OK) {
      cmSystemTools::Error("Problem with archive_read_next_header(): ",
                           archive_error_string(a));
      break;
    }
    if (verbose) {
      if (extract) {
        cmSystemTools::Stdout("x ");
        cmSystemTools::Stdout(cm_archive_entry_pathname(entry));
      } else {
        list_item_verbose(stdout, entry);
      }
      cmSystemTools::Stdout("\n");
    } else if (!extract) {
      cmSystemTools::Stdout(cm_archive_entry_pathname(entry));
      cmSystemTools::Stdout("\n");
    }
    if (extract) {
      r = archive_write_disk_set_options(ext, ARCHIVE_EXTRACT_TIME);
      if (r != ARCHIVE_OK) {
        cmSystemTools::Error("Problem with archive_write_disk_set_options(): ",
                             archive_error_string(ext));
        break;
      }

      r = archive_write_header(ext, entry);
      if (r == ARCHIVE_OK) {
        if (!copy_data(a, ext)) {
          break;
        }
        r = archive_write_finish_entry(ext);
        if (r != ARCHIVE_OK) {
          cmSystemTools::Error("Problem with archive_write_finish_entry(): ",
                               archive_error_string(ext));
          break;
        }
      }
#  ifdef _WIN32
      else if (const char* linktext = archive_entry_symlink(entry)) {
        std::cerr << "cmake -E tar: warning: skipping symbolic link \""
                  << cm_archive_entry_pathname(entry) << "\" -> \"" << linktext
                  << "\"." << std::endl;
      }
#  endif
      else {
        cmSystemTools::Error("Problem with archive_write_header(): ",
                             archive_error_string(ext));
        cmSystemTools::Error("Current file: " +
                             cm_archive_entry_pathname(entry));
        break;
      }
    }
  }